

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pty.c
# Opt level: O3

ptrlen pty_backend_exit_signame(Backend *be,char **aux_msg)

{
  char *pcVar1;
  size_t sVar2;
  uint __sig;
  ptrlen pVar3;
  
  *aux_msg = (char *)0x0;
  pcVar1 = "";
  if ((*(char *)((long)&be[-4].vt + 5) == '\x01') &&
     (__sig = *(uint *)&be[-4].interactor & 0x7f, 0x1ffffff < (int)(__sig * 0x1000000 + 0x1000000)))
  {
    sVar2 = 3;
    switch(__sig) {
    case 2:
      pcVar1 = "INT";
      break;
    case 3:
      sVar2 = 4;
      pcVar1 = "QUIT";
      break;
    case 4:
      pcVar1 = "ILL";
      break;
    default:
      pcVar1 = strsignal(__sig);
      pcVar1 = dupprintf("untranslatable signal number %d: %s",(ulong)__sig,pcVar1);
      *aux_msg = pcVar1;
    case 1:
      pcVar1 = "HUP";
      break;
    case 6:
      sVar2 = 4;
      pcVar1 = "ABRT";
      break;
    case 8:
      pcVar1 = "FPE";
      break;
    case 9:
      sVar2 = 4;
      pcVar1 = "KILL";
      break;
    case 10:
      sVar2 = 4;
      pcVar1 = "USR1";
      break;
    case 0xb:
      sVar2 = 4;
      pcVar1 = "SEGV";
      break;
    case 0xc:
      sVar2 = 4;
      pcVar1 = "USR2";
      break;
    case 0xd:
      sVar2 = 4;
      pcVar1 = "PIPE";
      break;
    case 0xe:
      sVar2 = 4;
      pcVar1 = "ALRM";
      break;
    case 0xf:
      sVar2 = 4;
      pcVar1 = "TERM";
    }
  }
  else {
    sVar2 = 0;
  }
  pVar3.len = sVar2;
  pVar3.ptr = pcVar1;
  return pVar3;
}

Assistant:

ptrlen pty_backend_exit_signame(Backend *be, char **aux_msg)
{
    *aux_msg = NULL;

    int sig = pty_backend_exit_signum(be);
    if (sig < 0)
        return PTRLEN_LITERAL("");

    #define SIGNAL_SUB(s) {                             \
        if (sig == SIG ## s)                            \
            return PTRLEN_LITERAL(#s);                  \
    }
    #define SIGNAL_MAIN(s, desc) SIGNAL_SUB(s)
    #define SIGNALS_LOCAL_ONLY
    #include "ssh/signal-list.h"
    #undef SIGNAL_MAIN
    #undef SIGNAL_SUB
    #undef SIGNALS_LOCAL_ONLY

    *aux_msg = dupprintf("untranslatable signal number %d: %s",
                         sig, strsignal(sig));
    return PTRLEN_LITERAL("HUP");      /* need some kind of default */
}